

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O3

int omac_acpkm_key(OMAC_ACPKM_CTX *c,EVP_CIPHER *cipher,uchar *key,size_t key_size)

{
  int iVar1;
  int iVar2;
  CMAC_ACPKM_CTX *pCVar3;
  EVP_CIPHER *pEVar4;
  size_t __n;
  uchar auStack_58 [40];
  
  pCVar3 = CMAC_ACPKM_CTX_new();
  c->cmac_ctx = pCVar3;
  if (pCVar3 == (CMAC_ACPKM_CTX *)0x0) {
    ERR_GOST_error(0x93,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                   ,0x197);
    return 0;
  }
  if (cipher == (EVP_CIPHER *)0x0) {
    if (key == (uchar *)0x0) goto LAB_00119924;
  }
  else {
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)pCVar3->cctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,
                               (uchar *)0x0,(uchar *)0x0);
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = EVP_CIPHER_is_a(cipher,"kuznyechik-cbc");
    if (iVar1 == 0) {
      return 1;
    }
    pEVar4 = (EVP_CIPHER *)cipher_gost_grasshopper_ctracpkm();
    iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)pCVar3->actx,pEVar4,(ENGINE *)0x0,(uchar *)0x0,
                               (uchar *)0x0);
    if (iVar1 == 0 || key == (uchar *)0x0) {
      if (iVar1 == 0) {
        return 1;
      }
      goto LAB_00119924;
    }
  }
  pEVar4 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)pCVar3->actx);
  if (pEVar4 == (EVP_CIPHER *)0x0) {
    return 1;
  }
  iVar1 = EVP_CIPHER_CTX_get_block_size(pCVar3->cctx);
  __n = (size_t)(iVar1 / 2);
  memset(auStack_58,0xff,__n);
  memset(auStack_58 + __n,0,__n);
  iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)pCVar3->actx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,
                             auStack_58);
  if (iVar2 == 0) {
    return 1;
  }
  pEVar4 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)pCVar3->actx);
  iVar2 = EVP_CIPHER_get_key_length(pEVar4);
  iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)pCVar3->actx,pCVar3->km,zero_iv,iVar1 + iVar2);
  if (iVar1 == 0) {
    return 1;
  }
  pEVar4 = EVP_CIPHER_CTX_cipher((EVP_CIPHER_CTX *)pCVar3->cctx);
  if (pEVar4 == (EVP_CIPHER *)0x0) {
    return 1;
  }
  iVar1 = EVP_CIPHER_CTX_set_key_length((EVP_CIPHER_CTX *)pCVar3->cctx,iVar2);
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)pCVar3->cctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             pCVar3->km,zero_iv);
  if (iVar1 == 0) {
    return 1;
  }
  pCVar3->nlast_block = 0;
LAB_00119924:
  c->key_set = 1;
  return 1;
}

Assistant:

static int omac_acpkm_key(OMAC_ACPKM_CTX *c, const EVP_CIPHER *cipher,
                          const unsigned char *key, size_t key_size)
{
    int ret = 0;

    c->cmac_ctx = CMAC_ACPKM_CTX_new();
    if (c->cmac_ctx == NULL) {
        GOSTerr(GOST_F_OMAC_ACPKM_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    ret = CMAC_ACPKM_Init(c->cmac_ctx, key, key_size, cipher, NULL);
    if (ret > 0) {
        c->key_set = 1;
    }
    return 1;
}